

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

void RunWycheproofDecryptTest(char *path,function<void_(FileTest_*,_evp_pkey_ctx_st_*)> *setup_cb)

{
  anon_class_8_1_3d7feedf local_40;
  function<void_(FileTest_*)> local_38;
  function<void_(FileTest_*,_evp_pkey_ctx_st_*)> *local_18;
  function<void_(FileTest_*,_evp_pkey_ctx_st_*)> *setup_cb_local;
  char *path_local;
  
  local_40.setup_cb = setup_cb;
  local_18 = setup_cb;
  setup_cb_local = (function<void_(FileTest_*,_evp_pkey_ctx_st_*)> *)path;
  std::function<void(FileTest*)>::
  function<RunWycheproofDecryptTest(char_const*,std::function<void(FileTest*,evp_pkey_ctx_st*)>)::__0,void>
            ((function<void(FileTest*)> *)&local_38,&local_40);
  FileTestGTest(path,&local_38);
  std::function<void_(FileTest_*)>::~function(&local_38);
  return;
}

Assistant:

static void RunWycheproofDecryptTest(
    const char *path,
    std::function<void(FileTest *, EVP_PKEY_CTX *)> setup_cb) {
  FileTestGTest(path, [&](FileTest *t) {
    t->IgnoreAllUnusedInstructions();

    std::vector<uint8_t> pkcs8;
    ASSERT_TRUE(t->GetInstructionBytes(&pkcs8, "privateKeyPkcs8"));
    CBS cbs;
    CBS_init(&cbs, pkcs8.data(), pkcs8.size());
    bssl::UniquePtr<EVP_PKEY> key(EVP_parse_private_key(&cbs));
    ASSERT_TRUE(key);

    std::vector<uint8_t> ct, msg;
    ASSERT_TRUE(t->GetBytes(&ct, "ct"));
    ASSERT_TRUE(t->GetBytes(&msg, "msg"));
    WycheproofResult result;
    ASSERT_TRUE(GetWycheproofResult(t, &result));

    bssl::UniquePtr<EVP_PKEY_CTX> ctx(EVP_PKEY_CTX_new(key.get(), nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_decrypt_init(ctx.get()));
    ASSERT_NO_FATAL_FAILURE(setup_cb(t, ctx.get()));
    std::vector<uint8_t> out(EVP_PKEY_size(key.get()));
    size_t len = out.size();
    int ret =
        EVP_PKEY_decrypt(ctx.get(), out.data(), &len, ct.data(), ct.size());
    // BoringSSL does not enforce policies on weak keys and leaves it to the
    // caller.
    bool is_valid = result.IsValid({"SmallModulus"});
    EXPECT_EQ(ret, is_valid ? 1 : 0);
    if (is_valid) {
      out.resize(len);
      EXPECT_EQ(Bytes(msg), Bytes(out));
    }
  });
}